

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O2

Byte * __thiscall
CharStringType2Interpreter::InterpretDiv
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  byte bVar1;
  byte bVar2;
  _List_node_base *p_Var3;
  int iVar4;
  Trace *this_00;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  CharStringOperand newOperand;
  value_type local_40;
  
  iVar4 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x21])
                    (this->mImplementationHelper,this);
  if (iVar4 == 0) {
    if ((this->mOperandStack).
        super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
        _M_size < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var3 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      bVar1 = *(byte *)&p_Var3[1]._M_next;
      p_Var3 = p_Var3[1]._M_prev;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      p_Var6 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      bVar2 = *(byte *)&p_Var6[1]._M_next;
      p_Var6 = p_Var6[1]._M_prev;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      if ((bVar2 & bVar1 & 1) == 0) {
        local_40.IsInteger = false;
        p_Var5 = p_Var3;
        if ((bVar1 & 1) != 0) {
          p_Var5 = (_List_node_base *)(double)(long)p_Var3;
        }
        if ((bVar2 & 1) != 0) {
          p_Var6 = (_List_node_base *)(double)(long)p_Var6;
          p_Var5 = p_Var3;
        }
        local_40.field_1.RealValue = (double)p_Var6 / (double)p_Var5;
      }
      else {
        local_40.IsInteger = true;
        local_40.field_1.IntegerValue = (long)p_Var6 / (long)p_Var3;
      }
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                (&this->mOperandStack,&local_40);
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretDiv(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Div(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;


	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}


	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	if(!valueA.IsInteger || !valueB.IsInteger)
	{
		newOperand.IsInteger = false;
		newOperand.RealValue = 
			(valueA.IsInteger ? (double)valueA.IntegerValue : valueA.RealValue)
			/
			(valueB.IsInteger ? (double)valueB.IntegerValue : valueB.RealValue);
	}
	else
	{
		newOperand.IsInteger = true;
		newOperand.IntegerValue = valueA.IntegerValue / valueB.IntegerValue;
	}
	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}